

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcargscontext_p.h
# Opt level: O3

void __thiscall
asmjit::v1_14::FuncArgsContext::WorkData::reassign
          (WorkData *this,uint32_t varId,uint32_t newId,uint32_t oldId)

{
  uint uVar1;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint8_t uVar2;
  uint in_R8D;
  
  if (oldId < 0x20) {
    in_R8D = this->_assignedRegs;
    if ((in_R8D >> (oldId & 0x1f) & 1) == 0) goto LAB_0011d090;
    oldId = oldId;
    if (0x1f < newId) goto LAB_0011d095;
    if ((in_R8D >> (newId & 0x1f) & 1) != 0) goto LAB_0011d09a;
    uVar1 = (uint)this->_physToVarId[oldId];
    if (this->_physToVarId[oldId] != varId) goto LAB_0011d09f;
    if (this->_physToVarId[newId] == 0xff) {
      this->_physToVarId[oldId] = 0xff;
      this->_physToVarId[newId] = (uint8_t)varId;
      this->_assignedRegs = 1 << ((byte)oldId & 0x1f) ^ 1 << ((byte)newId & 0x1f) ^ in_R8D;
      return;
    }
  }
  else {
    reassign();
LAB_0011d090:
    reassign();
LAB_0011d095:
    newId = oldId;
    reassign();
LAB_0011d09a:
    reassign();
    uVar1 = newId;
LAB_0011d09f:
    newId = uVar1;
    reassign();
  }
  reassign();
  if (extraout_EDX < 0x20) {
    if ((this->_assignedRegs >> (extraout_EDX & 0x1f) & 1) == 0) goto LAB_0011d0ed;
    if (0x1f < in_R8D) goto LAB_0011d0f2;
    if ((this->_assignedRegs >> (in_R8D & 0x1f) & 1) == 0) goto LAB_0011d0f7;
    if (this->_physToVarId[extraout_EDX] != varId) goto LAB_0011d0fc;
    if (this->_physToVarId[in_R8D] == newId) {
      this->_physToVarId[extraout_EDX] = (uint8_t)newId;
      this->_physToVarId[in_R8D] = (uint8_t)varId;
      return;
    }
  }
  else {
    swap();
LAB_0011d0ed:
    swap();
LAB_0011d0f2:
    swap();
LAB_0011d0f7:
    swap();
LAB_0011d0fc:
    swap();
  }
  uVar2 = (uint8_t)varId;
  swap();
  if (extraout_EDX_00 < 0x20) {
    uVar1 = this->_assignedRegs;
    if ((uVar1 >> (extraout_EDX_00 & 0x1f) & 1) == 0) {
      if (this->_physToVarId[extraout_EDX_00] == 0xff) {
        this->_physToVarId[extraout_EDX_00] = uVar2;
        this->_assignedRegs = uVar1 ^ 1 << ((byte)extraout_EDX_00 & 0x1f);
        return;
      }
      goto LAB_0011d13f;
    }
  }
  else {
    assign();
  }
  assign();
LAB_0011d13f:
  assign();
  return;
}

Assistant:

inline void reassign(uint32_t varId, uint32_t newId, uint32_t oldId) noexcept {
      ASMJIT_ASSERT( isAssigned(oldId));
      ASMJIT_ASSERT(!isAssigned(newId));
      ASMJIT_ASSERT(_physToVarId[oldId] == varId);
      ASMJIT_ASSERT(_physToVarId[newId] == kVarIdNone);

      _physToVarId[oldId] = uint8_t(kVarIdNone);
      _physToVarId[newId] = uint8_t(varId);
      _assignedRegs ^= Support::bitMask(newId) ^ Support::bitMask(oldId);
    }